

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O3

QSizeF __thiscall KDReports::ReportPrivate::paperSize(ReportPrivate *this)

{
  qreal mm;
  double dVar1;
  double in_XMM1_Qa;
  QSizeF QVar2;
  
  dVar1 = (this->m_paperSize).wd;
  if ((dVar1 <= 0.0) || (in_XMM1_Qa = (this->m_paperSize).ht, in_XMM1_Qa <= 0.0)) {
    mm = (qreal)QPageSize::size((int)this + 0x28);
    dVar1 = mmToPixels(mm);
    in_XMM1_Qa = mmToPixels(in_XMM1_Qa);
    (this->m_paperSize).wd = dVar1;
    (this->m_paperSize).ht = in_XMM1_Qa;
    if (this->m_orientation == Landscape) {
      QSizeF::transpose();
      dVar1 = (this->m_paperSize).wd;
      in_XMM1_Qa = (this->m_paperSize).ht;
    }
  }
  QVar2.ht = in_XMM1_Qa;
  QVar2.wd = dVar1;
  return QVar2;
}

Assistant:

QSizeF KDReports::ReportPrivate::paperSize() const
{
    // determine m_paperSize from m_pageSize if needed
    if (m_paperSize.isEmpty()) {
        const auto mmSize = m_pageSize.size(QPageSize::Millimeter);
        m_paperSize = QSizeF {mmToPixels(mmSize.width()), mmToPixels(mmSize.height())};
        if (m_orientation == QPageLayout::Landscape) {
            m_paperSize.transpose();
        }
    }
    // qDebug() << "m_paperSize=" << m_paperSize;
    return m_paperSize;
}